

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_cache.hpp
# Opt level: O0

void __thiscall
cappuccino::
fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::fifo_cache(fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
             *this,size_t capacity,float max_load_factor)

{
  size_type __n;
  allocator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  local_1d;
  float local_1c;
  size_t sStack_18;
  float max_load_factor_local;
  size_t capacity_local;
  fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  
  local_1c = max_load_factor;
  sStack_18 = capacity;
  capacity_local = (size_t)this;
  mutex<(cappuccino::thread_safe)1,_std::mutex>::mutex(&this->m_lock);
  __n = sStack_18;
  this->m_used_size = 0;
  std::
  allocator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  ::allocator(&local_1d);
  std::__cxx11::
  list<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
  ::list(&this->m_fifo_list,__n,&local_1d);
  std::
  allocator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  ::~allocator(&local_1d);
  std::
  unordered_map<unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>_>_>
  ::unordered_map(&this->m_keyed_elements);
  std::
  unordered_map<unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>_>_>
  ::max_load_factor(&this->m_keyed_elements,local_1c);
  std::
  unordered_map<unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>_>_>
  ::reserve(&this->m_keyed_elements,sStack_18);
  return;
}

Assistant:

explicit fifo_cache(size_t capacity, float max_load_factor = 1.0f) : m_fifo_list(capacity)
    {
        m_keyed_elements.max_load_factor(max_load_factor);
        m_keyed_elements.reserve(capacity);
    }